

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

QString * __thiscall
QXmlStreamReader::readElementText
          (QString *__return_storage_ptr__,QXmlStreamReader *this,ReadElementTextBehaviour behaviour
          )

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> this_00;
  qsizetype i;
  TokenType TVar1;
  const_pointer unicode;
  qsizetype size;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  if ((this_00._M_head_impl)->type == StartElement) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
switchD_00355f83_caseD_7:
    TVar1 = readNext(this);
    switch(TVar1) {
    case StartElement:
      if (behaviour == IncludeChildElements) {
        readElementText((QString *)&local_50,this,IncludeChildElements);
        QString::append(__return_storage_ptr__,(QString *)&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        goto switchD_00355f83_caseD_7;
      }
      if (behaviour == SkipChildElements) {
        skipCurrentElement(this);
        goto switchD_00355f83_caseD_7;
      }
      break;
    case EndElement:
      goto switchD_00355f83_caseD_5;
    case Characters:
    case EntityReference:
      goto switchD_00355f83_caseD_6;
    case Comment:
    case ProcessingInstruction:
      goto switchD_00355f83_caseD_7;
    }
    if ((behaviour == ErrorOnUnexpectedElement) || ((this_00._M_head_impl)->error != NoError)) {
      if ((this_00._M_head_impl)->error == NoError) {
        QXmlStream::tr((QString *)&local_50,"Expected character data.",(char *)0x0,-1);
        QXmlStreamReaderPrivate::raiseError
                  (this_00._M_head_impl,UnexpectedElementError,(QString *)&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      }
      goto switchD_00355f83_caseD_5;
    }
    goto switchD_00355f83_caseD_7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_003560e6:
  __stack_chk_fail();
switchD_00355f83_caseD_6:
  i = (__return_storage_ptr__->d).size;
  unicode = QtPrivate::XmlStringRef::data(&(this_00._M_head_impl)->text);
  size = QtPrivate::XmlStringRef::size(&(this_00._M_head_impl)->text);
  QString::insert(__return_storage_ptr__,i,unicode,size);
  goto switchD_00355f83_caseD_7;
switchD_00355f83_caseD_5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  goto LAB_003560e6;
}

Assistant:

QString QXmlStreamReader::readElementText(ReadElementTextBehaviour behaviour)
{
    Q_D(QXmlStreamReader);
    if (isStartElement()) {
        QString result;
        forever {
            switch (readNext()) {
            case Characters:
            case EntityReference:
                result.insert(result.size(), d->text);
                break;
            case EndElement:
                return result;
            case ProcessingInstruction:
            case Comment:
                break;
            case StartElement:
                if (behaviour == SkipChildElements) {
                    skipCurrentElement();
                    break;
                } else if (behaviour == IncludeChildElements) {
                    result += readElementText(behaviour);
                    break;
                }
                Q_FALLTHROUGH();
            default:
                if (d->error || behaviour == ErrorOnUnexpectedElement) {
                    if (!d->error)
                        d->raiseError(UnexpectedElementError, QXmlStream::tr("Expected character data."));
                    return result;
                }
            }
        }